

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

cmListFileLexer * cmListFileLexer_New(void)

{
  cmListFileLexer *lexer;
  
  lexer = (cmListFileLexer *)malloc(0x68);
  if (lexer == (cmListFileLexer *)0x0) {
    lexer = (cmListFileLexer *)0x0;
  }
  else {
    memset(lexer,0,0x68);
    lexer->line = 1;
    lexer->column = 1;
  }
  return lexer;
}

Assistant:

cmListFileLexer* cmListFileLexer_New(void)
{
  cmListFileLexer* lexer = (cmListFileLexer*)malloc(sizeof(cmListFileLexer));
  if (!lexer) {
    return 0;
  }
  memset(lexer, 0, sizeof(*lexer));
  lexer->line = 1;
  lexer->column = 1;
  return lexer;
}